

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_TELEPORT(effect_handler_context_t_conflict *context)

{
  loc_conflict *plVar1;
  int iVar2;
  loc_conflict lVar3;
  uint32_t uVar4;
  uint uVar5;
  bool bVar6;
  bool bVar7;
  player *p;
  _Bool _Var8;
  bool bVar9;
  int iVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  wchar_t wVar13;
  uint uVar14;
  loc_conflict lVar15;
  monster *pmVar16;
  loc lVar17;
  monster_conflict *mon;
  square *psVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  int iVar22;
  char *fmt;
  chunk_conflict *c;
  int iVar23;
  loc_conflict p_00;
  ulong uVar24;
  ulong uVar25;
  uint local_70;
  uint32_t local_6c;
  long local_60;
  
  lVar15 = loc(context->x,context->y);
  iVar19 = (context->value).base;
  iVar22 = (context->value).m_bonus;
  uVar5._0_2_ = z_info->dungeon_wid;
  uVar5._2_2_ = z_info->town_hgt;
  uVar20 = (uint)z_info->dungeon_hgt;
  if (z_info->dungeon_hgt < (ushort)(undefined2)uVar5) {
    uVar20 = uVar5;
  }
  iVar2 = context->subtype;
  bVar6 = (context->origin).what != SRC_MONSTER;
  bVar7 = iVar2 != 0;
  pmVar16 = monster_target_monster(context);
  context->ident = true;
  if (player->upkeep->arena_level != false) {
    return true;
  }
  _Var8 = loc_is_zero(lVar15);
  if (_Var8) {
    if (pmVar16 == (monster *)0x0) {
      if (bVar6 || bVar7) {
        lVar17 = cave_find_decoy(cave);
        _Var8 = loc_is_zero((loc_conflict)lVar17);
        if (!_Var8 && iVar2 != 0) {
          square_destroy_decoy(cave,lVar17);
          return true;
        }
        plVar1 = &player->grid;
        lVar15.y = 0;
        lVar15.x = plVar1->x;
        lVar17.x = plVar1->x;
        lVar17.y = plVar1->y;
        uVar25 = (ulong)(uint)(player->grid).y;
        _Var8 = square_isno_teleport(cave,lVar17);
        if ((!_Var8) || (iVar19 < 0xb && iVar19 != 0)) {
          _Var8 = player_of_has(player,L'\x1d');
          if (!_Var8) {
            _Var8 = flag_has_dbg((player->state).pflags,10,0x37,"player->state.pflags",
                                 "(PF_PHASEWALK)");
            if (_Var8 && iVar2 != 0) {
              fmt = "Teleport resistance!";
              goto LAB_001409bc;
            }
            goto LAB_00140745;
          }
          equip_learn_flag(player,L'\x1d');
        }
        fmt = "Teleportation forbidden!";
        goto LAB_001409bc;
      }
      if ((context->origin).what != SRC_MONSTER) {
        __assert_fail("context->origin.what == SRC_MONSTER",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/effect-handler-general.c"
                      ,0xa7e,"_Bool effect_handler_TELEPORT(effect_handler_context_t *)");
      }
      pmVar16 = cave_monster(cave,(context->origin).which.grid.x);
    }
    lVar15.y = 0;
    lVar15.x = (pmVar16->grid).x;
    uVar25 = (ulong)(uint)(pmVar16->grid).y;
  }
  else {
    uVar25 = (ulong)lVar15 >> 0x20;
  }
LAB_00140745:
  iVar23 = lVar15.x;
  if (iVar22 != 0) {
    iVar10 = (int)uVar25;
    iVar19 = cave->height - iVar10;
    if (iVar19 < iVar10) {
      iVar19 = iVar10;
    }
    iVar10 = cave->width - iVar23;
    if (iVar10 < iVar23) {
      iVar10 = iVar23;
    }
    if (iVar10 < iVar19) {
      iVar10 = iVar19;
    }
    iVar19 = (iVar10 * iVar22) / 100;
  }
  uVar11 = Rand_div(2);
  iVar22 = iVar19 + 3;
  if (-1 < iVar19) {
    iVar22 = iVar19;
  }
  uVar12 = Rand_div(iVar22 >> 2);
  uVar4 = -uVar12;
  if (uVar11 != 0) {
    uVar4 = uVar12;
  }
  c = cave;
  if (2 < cave->height) {
    local_70 = (uVar20 & 0xffff) * 2;
    uVar21 = (ulong)lVar15 & 0xffffffff;
    bVar9 = true;
    p_00.x = 0;
    p_00.y = 0;
    local_60 = 1;
    local_6c = 0;
    do {
      if (2 < c->width) {
        uVar24 = 1;
        do {
          lVar17 = (loc)(local_60 << 0x20 | uVar24);
          wVar13 = distance((loc_conflict)lVar17,(loc_conflict)((uVar25 << 0x20) + uVar21));
          uVar20 = wVar13 - (iVar19 + uVar4);
          uVar5 = -uVar20;
          if (0 < (int)uVar20) {
            uVar5 = uVar20;
          }
          if ((wVar13 != L'\0') &&
             (_Var8 = has_teleport_destination_prereqs((chunk *)cave,lVar17,bVar6 || bVar7), _Var8))
          {
            _Var8 = square_isvault(cave,lVar17);
            if (_Var8) {
              if (!bVar9) goto LAB_001408cf;
            }
            else {
              if (bVar9) {
                uVar20._0_2_ = z_info->dungeon_wid;
                uVar20._2_2_ = z_info->town_hgt;
                uVar14 = (uint)z_info->dungeon_hgt;
                if (z_info->dungeon_hgt < (ushort)(undefined2)uVar20) {
                  uVar14 = uVar20;
                }
                local_70 = (uVar14 & 0xffff) * 2;
              }
              bVar9 = false;
            }
            if ((int)uVar5 <= (int)local_70) {
              lVar15 = (loc_conflict)mem_zalloc(0x10);
              *(int *)lVar15 = (int)uVar24;
              *(int *)((long)lVar15 + 4) = (int)local_60;
              if (uVar5 < local_70) {
                while (p_00 != (loc_conflict)0x0) {
                  lVar3 = *(loc_conflict *)((long)p_00 + 8);
                  mem_free((void *)p_00);
                  p_00 = lVar3;
                }
                local_6c = 1;
                p_00 = lVar15;
                local_70 = uVar5;
              }
              else {
                *(loc_conflict *)((long)lVar15 + 8) = p_00;
                local_6c = local_6c + 1;
                p_00 = lVar15;
              }
            }
          }
LAB_001408cf:
          uVar24 = uVar24 + 1;
          c = cave;
        } while ((long)uVar24 < (long)cave->width + -1);
      }
      local_60 = local_60 + 1;
    } while (local_60 < (long)c->height + -1);
    if (local_6c != 0) {
      uVar11 = Rand_div(local_6c);
      for (; uVar11 != 0; uVar11 = uVar11 - 1) {
        lVar15 = *(loc_conflict *)((long)p_00 + 8);
        mem_free((void *)p_00);
        p_00 = lVar15;
      }
      bVar9 = !bVar6 && !bVar7;
      if (iVar2 == 0 && (bVar6 || bVar7)) {
        _Var8 = flag_has_dbg((player->state).pflags,10,0x37,"player->state.pflags","(PF_PHASEWALK)")
        ;
        p = player;
        iVar19 = 10;
        if (_Var8) {
          wVar13 = distance((loc_conflict)(uVar21 + (uVar25 << 0x20)),*(loc_conflict *)p_00);
          player_add_speed_boost(p,wVar13 + L'\x14');
        }
      }
      else {
        iVar19 = (uint)bVar9 + (uint)bVar9 * 4 + 10;
      }
      sound(iVar19);
      monster_swap((loc)(uVar21 | uVar25 << 0x20),*(loc *)p_00);
      if (bVar6 || bVar7) {
        player_handle_post_move(player,true,(context->origin).what == SRC_MONSTER);
      }
      psVar18 = square(cave,*(loc *)p_00);
      flag_off(psVar18->info,3,0x12);
      pmVar16 = target_get_monster();
      _Var8 = target_able(pmVar16);
      if (!_Var8) {
        target_set_monster((monster *)0x0);
      }
      handle_stuff(player);
      do {
        lVar15 = *(loc_conflict *)((long)p_00 + 8);
        mem_free((void *)p_00);
        p_00 = lVar15;
      } while (lVar15 != (loc_conflict)0x0);
      return true;
    }
  }
  if (!bVar6 && !bVar7) {
    mon = (monster_conflict *)cave_monster(c,(context->origin).which.grid.x);
    _Var8 = square_isseen(cave,mon->grid);
    if (!_Var8) {
      return true;
    }
    add_monster_message(mon,L'2',true);
    return true;
  }
  fmt = "Failed to find teleport destination!";
LAB_001409bc:
  msg(fmt);
  return true;
}

Assistant:

bool effect_handler_TELEPORT(effect_handler_context_t *context)
{
	struct loc start = loc(context->x, context->y);
	int dis = context->value.base;
	int perc = context->value.m_bonus;
	int pick;
	struct loc grid;

	struct jumps {
		struct loc grid;
		struct jumps *next;
	} *spots = NULL;
	int num_spots = 0;
	int current_score = 2 * MAX(z_info->dungeon_wid, z_info->dungeon_hgt);
	bool only_vault_grids_possible = true;

	bool hostile = context->subtype ? true : false;
	bool is_player = (context->origin.what != SRC_MONSTER || hostile);
	struct monster *t_mon = monster_target_monster(context);

	context->ident = true;

	/* No teleporting in arena levels */
	if (player->upkeep->arena_level) return true;

	/* Establish the coordinates to teleport from, if we don't know already */
	if (!loc_is_zero(start)) {
		/* We're good */
	} else if (t_mon) {
		/* Monster targeting another monster */
		start = t_mon->grid;
	} else if (is_player) {
		/* Decoys get destroyed */
		struct loc decoy = cave_find_decoy(cave);
		if (!loc_is_zero(decoy) && hostile) {
			square_destroy_decoy(cave, decoy);
			return true;
		}

		start = player->grid;

		/* Check for a no teleport grid */
		if (square_isno_teleport(cave, start) &&
			((dis > 10) || (dis == 0))) {
			msg("Teleportation forbidden!");
			return true;
		}

		/* Check for a no teleport curse */
		if (player_of_has(player, OF_NO_TELEPORT)) {
			equip_learn_flag(player, OF_NO_TELEPORT);
			msg("Teleportation forbidden!");
			return true;
		}

		/* Check for teleport resistance */
		if (player_has(player, PF_PHASEWALK) && hostile) {
			msg("Teleport resistance!");
			return true;
		}
	} else {
		assert(context->origin.what == SRC_MONSTER);
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		start = mon->grid;
	}

	/* Percentage of the largest cardinal distance to an edge */
	if (perc) {
		int vertical = MAX(start.y, cave->height - start.y);
		int horizontal = MAX(start.x, cave->width - start.x);
		dis = (MAX(vertical, horizontal) * perc) / 100;
	}

	/* Randomise the distance a little */
	if (one_in_(2)) {
		dis -= randint0(dis / 4);
	} else {
		dis += randint0(dis / 4);
	}

	/* Make a list of the best grids, scoring by how good an approximation
	 * the distance from the start is to the distance we want */
	for (grid.y = 1; grid.y < cave->height - 1; grid.y++) {
		for (grid.x = 1; grid.x < cave->width - 1; grid.x++) {
			int d = distance(grid, start);
			int score = ABS(d - dis);
			struct jumps *new;

			/* Must move */
			if (d == 0) continue;

			if (!has_teleport_destination_prereqs(cave, grid,
					is_player)) continue;

			/* No teleporting into vaults and such, unless there's no choice */
			if (square_isvault(cave, grid)) {
				if (!only_vault_grids_possible) {
					continue;
				}
			} else {
				/* Just starting to consider non-vault grids, so reset score */
				if (only_vault_grids_possible) {
					current_score = 2 * MAX(z_info->dungeon_wid,
											z_info->dungeon_hgt);
				}
				only_vault_grids_possible = false;
			}

			/* Do we have better spots already? */
			if (score > current_score) continue;

			/* Make a new spot */
			new = mem_zalloc(sizeof(struct jumps));
			new->grid = grid;

			/* If improving start a new list, otherwise extend the old one */
			if (score < current_score) {
				current_score = score;
				while (spots) {
					struct jumps *next = spots->next;
					mem_free(spots);
					spots = next;
				}
				spots = new;
				num_spots = 1;
			} else {
				new->next = spots;
				spots = new;
				num_spots++;
			}
		}
	}

	/* Report failure (very unlikely) */
	if (!num_spots) {
		if (is_player) {
			msg("Failed to find teleport destination!");
		} else {
			/*
			 * With either teleport self or teleport other, it'll
			 * be the caster that is puzzled.
			 */
			struct monster *mon = cave_monster(cave,
				context->origin.which.monster);

			if (square_isseen(cave, mon->grid)) {
				add_monster_message(mon, MON_MSG_BRIEF_PUZZLE,
					true);
			}
		}
		return true;
	}

	/* Pick a spot */
	pick = randint0(num_spots);
	while (pick) {
		struct jumps *next = spots->next;
		mem_free(spots);
		spots = next;
		pick--;
	}

	/* Check for specialty speed boost on friendly teleports */
	if (is_player && !hostile && player_has(player, PF_PHASEWALK)) {
		player_add_speed_boost(player, 20 + distance(start, spots->grid));
	}

	/* Sound */
	sound(is_player ? MSG_TELEPORT : MSG_TPOTHER);

	/* Move player or monster */
	monster_swap(start, spots->grid);
	if (is_player) {
		player_handle_post_move(player, true,
			context->origin.what == SRC_MONSTER);
	}

	/* Clear any projection marker to prevent double processing */
	sqinfo_off(square(cave, spots->grid)->info, SQUARE_PROJECT);

	/* Clear monster target if it's no longer visible */
	if (!target_able(target_get_monster())) {
		target_set_monster(NULL);
	}

	/* Lots of updates after monster_swap */
	handle_stuff(player);

	while (spots) {
		struct jumps *next = spots->next;
		mem_free(spots);
		spots = next;
	}

	return true;
}